

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

QNetworkReply * __thiscall
QNetworkAccessManager::put
          (QNetworkAccessManager *this,QNetworkRequest *request,QHttpMultiPart *multiPart)

{
  QNetworkReply *pQVar1;
  long in_FS_OFFSET;
  QNetworkRequest newRequest;
  QNetworkRequest local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkAccessManagerPrivate::prepareMultipart
            ((QNetworkAccessManagerPrivate *)&stack0xffffffffffffffd8,request,
             (QHttpMultiPart *)request);
  pQVar1 = put(this,&stack0xffffffffffffffd8,*(QIODevice **)(*(long *)&multiPart->field_0x8 + 0xb0))
  ;
  QNetworkRequest::~QNetworkRequest(&stack0xffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::put(const QNetworkRequest &request, QHttpMultiPart *multiPart)
{
    QNetworkRequest newRequest = d_func()->prepareMultipart(request, multiPart);
    QIODevice *device = multiPart->d_func()->device;
    QNetworkReply *reply = put(newRequest, device);
    return reply;
}